

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O1

void seta_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar9;
  long lVar10;
  float fVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  byte bVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  
  __s = *outputs;
  pDVar9 = outputs[1];
  uVar12 = (ulong)samples;
  lVar20 = 0;
  memset(__s,0,uVar12 * 4);
  memset(outputs[1],0,uVar12 * 4);
  do {
    bVar2 = *(byte *)((long)param + lVar20 * 8 + 0x1c);
    if (((bVar2 & 1) != 0) && (*(char *)((long)param + lVar20 + 0x20a0) == '\0')) {
      if ((bVar2 & 2) == 0) {
        bVar5 = *(byte *)((long)param + lVar20 * 8 + 0x1e) >> (bVar2 >> 7);
        if (bVar5 == 0) {
          bVar5 = 4;
        }
        uVar13 = *(uint *)((long)param + lVar20 * 4 + 0x201c);
        uVar14 = *(uint *)((long)param + 0x209c);
        uVar8 = *(uint *)((long)param + 0x18);
        if (samples != 0) {
          lVar10 = *(long *)((long)param + 0x10);
          bVar3 = *(byte *)((long)param + lVar20 * 8 + 0x20);
          bVar4 = *(byte *)((long)param + lVar20 * 8 + 0x21);
          bVar18 = *(byte *)((long)param + lVar20 * 8 + 0x1d);
          uVar19 = 0;
          do {
            pcVar16 = (char *)((ulong)(uVar13 >> 0xe) + (ulong)bVar3 * 0x1000 + lVar10);
            if ((char *)(lVar10 + (ulong)bVar4 * -0x1000 + 0x100000) <= pcVar16) {
              *(byte *)((long)param + lVar20 * 8 + 0x1c) = bVar2 & 0xfe;
              break;
            }
            iVar15 = (int)*pcVar16;
            iVar21 = (uint)(bVar18 >> 4) * 0x222 * iVar15;
            iVar17 = iVar21 + 0xff;
            if (-1 < iVar21) {
              iVar17 = iVar21;
            }
            __s[uVar19] = __s[uVar19] + (iVar17 >> 8);
            iVar15 = iVar15 * (bVar18 & 0xf) * 0x222;
            iVar17 = iVar15 + 0xff;
            if (-1 < iVar15) {
              iVar17 = iVar15;
            }
            piVar1 = pDVar9 + uVar19;
            *piVar1 = *piVar1 + (iVar17 >> 8);
            uVar13 = uVar13 + (int)(long)(((float)bVar5 * (float)uVar14 * 0.00012207031 * 16384.0) /
                                          (float)uVar8 + 0.5);
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        *(uint *)((long)param + lVar20 * 4 + 0x201c) = uVar13;
      }
      else {
        uVar7 = *(ushort *)((long)param + lVar20 * 8 + 0x1e);
        uVar13 = *(uint *)((long)param + lVar20 * 4 + 0x201c);
        uVar14 = *(uint *)((long)param + lVar20 * 4 + 0x205c);
        fVar11 = (float)*(uint *)((long)param + 0x209c) * 0.0078125 * 0.0009765625 * 0.25;
        bVar5 = *(byte *)((long)param + lVar20 * 8 + 0x20);
        if (samples != 0) {
          bVar3 = *(byte *)((long)param + lVar20 * 8 + 0x1d);
          bVar4 = *(byte *)((long)param + lVar20 * 8 + 0x21);
          uVar8 = *(uint *)((long)param + 0x18);
          bVar18 = *(byte *)((long)param + lVar20 * 8 + 0x1c);
          uVar19 = 1;
          do {
            bVar24 = (bVar18 & 4) == 0;
            bVar22 = uVar14 < 0x800000;
            if (bVar22 || bVar24) {
              bVar6 = *(byte *)((long)param +
                               (ulong)(uVar14 >> 0x10 & 0x7f) + (ulong)bVar4 * 0x80 + 0x1c);
              iVar15 = *(char *)((long)param +
                                (ulong)(uVar13 >> 0xe & 0x7f) + (ulong)bVar3 * 0x80 + 0x101c) *
                       0x222;
              iVar21 = (uint)(bVar6 >> 4) * iVar15;
              iVar17 = iVar21 + 0xff;
              if (-1 < iVar21) {
                iVar17 = iVar21;
              }
              __s[uVar19 - 1] = __s[uVar19 - 1] + (iVar17 >> 8);
              iVar15 = (bVar6 & 0xf) * iVar15;
              iVar17 = iVar15 + 0xff;
              if (-1 < iVar15) {
                iVar17 = iVar15;
              }
              piVar1 = pDVar9 + (uVar19 - 1);
              *piVar1 = *piVar1 + (iVar17 >> 8);
              uVar13 = uVar13 + (int)(long)(((float)(uVar7 >> (bVar2 >> 7)) * fVar11 * 16384.0) /
                                            (float)uVar8 + 0.5);
              uVar14 = uVar14 + (int)(long)(((float)bVar5 * fVar11 * 65536.0) / (float)uVar8 + 0.5);
            }
            else {
              bVar18 = bVar18 & 0xfe;
              *(byte *)((long)param + lVar20 * 8 + 0x1c) = bVar18;
            }
            bVar23 = uVar19 < uVar12;
            uVar19 = uVar19 + 1;
          } while ((bVar22 || bVar24) && bVar23);
        }
        *(uint *)((long)param + lVar20 * 4 + 0x201c) = uVar13;
        *(uint *)((long)param + lVar20 * 4 + 0x205c) = uVar14;
      }
    }
    lVar20 = lVar20 + 1;
    if (lVar20 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

static void seta_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	x1_010_state *info = (x1_010_state *)param;
	X1_010_CHANNEL  *reg;
	UINT32  ch;
	UINT32  i;
	int     volL, volR, freq, div;
	INT8    *start, *end, data;
	UINT8   *env;
	UINT32  smp_offs, smp_step, env_offs, env_step, delta;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];

	// mixer buffer zero clear
	memset( outputs[0], 0, samples*sizeof(*outputs[0]) );
	memset( outputs[1], 0, samples*sizeof(*outputs[1]) );

//	if( info->sound_enable == 0 ) return;

	for( ch = 0; ch < SETA_NUM_CHANNELS; ch++ ) {
		reg = (X1_010_CHANNEL *)&(info->reg[ch*sizeof(X1_010_CHANNEL)]);
		if( (reg->status&1) != 0 && ! info->Muted[ch]) {        // Key On
			div = (reg->status&0x80) ? 1 : 0;
			if( (reg->status&2) == 0 ) {                        // PCM sampling
				start    = (INT8 *)(info->rom + reg->start*0x1000);
				end      = (INT8 *)(info->rom + (0x100-reg->end)*0x1000);
				volL     = ((reg->volume>>4)&0xf)*VOL_BASE;
				volR     = ((reg->volume>>0)&0xf)*VOL_BASE;
				smp_offs = info->smp_offset[ch];
				freq     = reg->frequency>>div;
				// Meta Fox does write the frequency register, but this is a hack to make it "work" with the current setup
				// This is broken for Arbalester (it writes 8), but that'll be fixed later.
				if( freq == 0 ) freq = 4;
				smp_step = (UINT32)((float)info->base_clock/8192.0f
							*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play sample %p - %p, channel %X volume %d:%d freq %X step %X offset %X\n",
						start, end, ch, volL, volR, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					delta = smp_offs>>FREQ_BASE_BITS;
					// sample ended?
					if( start+delta >= end ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					data = start[delta];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
				}
				info->smp_offset[ch] = smp_offs;
			} else {                                            // Wave form
				start    = (INT8 *)&(info->reg[reg->volume*128+0x1000]);
				smp_offs = info->smp_offset[ch];
				freq     = ((reg->pitch_hi<<8)+reg->frequency)>>div;
				smp_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);

				env      = (UINT8 *)&(info->reg[reg->end*128]);
				env_offs = info->env_offset[ch];
				env_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*reg->start*(1<<ENV_BASE_BITS)/(float)info->rate+0.5f);
				/* Print some more debug info */
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play waveform %X, channel %X volume %X freq %4X step %X offset %X\n",
						reg->volume, ch, reg->end, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					int vol;
					delta = env_offs>>ENV_BASE_BITS;
					// Envelope one shot mode
					if( (reg->status&4) != 0 && delta >= 0x80 ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					vol = env[delta&0x7f];
					volL = ((vol>>4)&0xf)*VOL_BASE;
					volR = ((vol>>0)&0xf)*VOL_BASE;
					data  = start[(smp_offs>>FREQ_BASE_BITS)&0x7f];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
					env_offs += env_step;
				}
				info->smp_offset[ch] = smp_offs;
				info->env_offset[ch] = env_offs;
			}
		}
	}
}